

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

fctchk_t *
fctchk_new(int is_pass,char *cndtn,char *file,int lineno,char *format,__va_list_tag *args)

{
  fctchk_t *chk;
  __va_list_tag *args_local;
  char *format_local;
  int lineno_local;
  char *file_local;
  char *cndtn_local;
  fctchk_t *pfStack_10;
  int is_pass_local;
  
  if (cndtn == (char *)0x0) {
    __assert_fail("cndtn != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36b
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
                 );
  }
  if (file == (char *)0x0) {
    __assert_fail("file != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36c
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
                 );
  }
  if (lineno < 1) {
    __assert_fail("lineno > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x36d
                  ,
                  "fctchk_t *fctchk_new(int, const char *, const char *, int, const char *, __va_list_tag *)"
                 );
  }
  pfStack_10 = (fctchk_t *)calloc(1,0x308);
  if (pfStack_10 == (fctchk_t *)0x0) {
    pfStack_10 = (fctchk_t *)0x0;
  }
  else {
    fctstr_safe_cpy((char *)pfStack_10,cndtn,0x100);
    fctstr_safe_cpy(pfStack_10->file,file,0x100);
    pfStack_10->lineno = lineno;
    pfStack_10->is_pass = is_pass;
    if (format == (char *)0x0) {
      fctstr_safe_cpy(pfStack_10->msg,cndtn,0x100);
    }
    else {
      fct_vsnprintf(pfStack_10->msg,0x100,format,args);
    }
  }
  return pfStack_10;
}

Assistant:

static fctchk_t*
fctchk_new(int is_pass,
           char const *cndtn,
           char const *file,
           int lineno,
           char const *format,
           va_list args)
{
    fctchk_t *chk = NULL;

    FCT_ASSERT( cndtn != NULL );
    FCT_ASSERT( file != NULL );
    FCT_ASSERT( lineno > 0 );

    chk = (fctchk_t*)calloc(1, sizeof(fctchk_t));
    if ( chk == NULL )
    {
        return NULL;
    }

    fctstr_safe_cpy(chk->cndtn, cndtn, FCT_MAX_LOG_LINE);
    fctstr_safe_cpy(chk->file, file, FCT_MAX_LOG_LINE);
    chk->lineno = lineno;

    chk->is_pass =is_pass;

    if ( format != NULL )
    {
        fct_vsnprintf(chk->msg, FCT_MAX_LOG_LINE, format, args);
    }
    else
    {
        /* Default to make the condition be the message, if there was no format
        specified. */
        fctstr_safe_cpy(chk->msg, cndtn, FCT_MAX_LOG_LINE);
    }

    return chk;
}